

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O3

void ImVector_ImFontConfig_resize(ImVector_ImFontConfig *self,int new_size)

{
  ImFontConfig *__dest;
  int iVar1;
  
  iVar1 = self->Capacity;
  if (iVar1 < new_size) {
    if (iVar1 == 0) {
      iVar1 = 8;
    }
    else {
      iVar1 = iVar1 / 2 + iVar1;
    }
    if (iVar1 <= new_size) {
      iVar1 = new_size;
    }
    __dest = (ImFontConfig *)ImGui::MemAlloc((long)iVar1 * 0x88);
    if (self->Data != (ImFontConfig *)0x0) {
      memcpy(__dest,self->Data,(long)self->Size * 0x88);
      ImGui::MemFree(self->Data);
    }
    self->Data = __dest;
    self->Capacity = iVar1;
  }
  self->Size = new_size;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontConfig_resize(ImVector_ImFontConfig* self,int new_size)
{
    return self->resize(new_size);
}